

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-tcp-bind-error.c
# Opt level: O0

int run_test_tcp_bind_error_addrinuse_listen(void)

{
  int iVar1;
  undefined8 uVar2;
  uv_loop_t *loop;
  int64_t eval_b_8;
  int64_t eval_a_8;
  int64_t eval_b_7;
  int64_t eval_a_7;
  int64_t eval_b_6;
  int64_t eval_a_6;
  int64_t eval_b_5;
  int64_t eval_a_5;
  int64_t eval_b_4;
  int64_t eval_a_4;
  int64_t eval_b_3;
  int64_t eval_a_3;
  int64_t eval_b_2;
  int64_t eval_a_2;
  int64_t eval_b_1;
  int64_t eval_a_1;
  int64_t eval_b;
  int64_t eval_a;
  undefined1 local_1d0 [4];
  int r;
  uv_tcp_t server2;
  uv_tcp_t server1;
  sockaddr_in addr;
  
  iVar1 = uv_ip4_addr("0.0.0.0",0x23a3,&server1.queued_fds);
  if ((long)iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-tcp-bind-error.c"
            ,0x55,"uv_ip4_addr(\"0.0.0.0\", 9123, &addr)","==","0",(long)iVar1,"==",0);
    abort();
  }
  uVar2 = uv_default_loop();
  iVar1 = uv_tcp_init(uVar2,&server2.queued_fds);
  if ((long)iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-tcp-bind-error.c"
            ,0x57,"r","==","0",(long)iVar1,"==",0);
    abort();
  }
  iVar1 = uv_tcp_bind(&server2.queued_fds,&server1.queued_fds,0);
  if ((long)iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-tcp-bind-error.c"
            ,0x59,"r","==","0",(long)iVar1,"==",0);
    abort();
  }
  uVar2 = uv_default_loop();
  iVar1 = uv_tcp_init(uVar2,local_1d0);
  if ((long)iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-tcp-bind-error.c"
            ,0x5c,"r","==","0",(long)iVar1,"==",0);
    abort();
  }
  iVar1 = uv_tcp_bind(local_1d0,&server1.queued_fds,0);
  if ((long)iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-tcp-bind-error.c"
            ,0x5e,"r","==","0",(long)iVar1,"==",0);
    abort();
  }
  iVar1 = uv_listen(&server2.queued_fds,0x80,0);
  if ((long)iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-tcp-bind-error.c"
            ,0x61,"r","==","0",(long)iVar1,"==",0);
    abort();
  }
  iVar1 = uv_listen(local_1d0,0x80,0);
  if ((long)iVar1 != -0x62) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-tcp-bind-error.c"
            ,99,"r","==","UV_EADDRINUSE",(long)iVar1,"==",0xffffffffffffff9e);
    abort();
  }
  uv_close(&server2.queued_fds,close_cb);
  uv_close(local_1d0,close_cb);
  uVar2 = uv_default_loop();
  uv_run(uVar2,0);
  if ((long)close_cb_called != 2) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-tcp-bind-error.c"
            ,0x6a,"2","==","close_cb_called",2,"==",(long)close_cb_called);
    abort();
  }
  loop = (uv_loop_t *)uv_default_loop();
  close_loop(loop);
  uVar2 = uv_default_loop();
  iVar1 = uv_loop_close(uVar2);
  if ((long)iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-tcp-bind-error.c"
            ,0x6c,"0","==","uv_loop_close(uv_default_loop())",0,"==",(long)iVar1);
    abort();
  }
  uv_library_shutdown();
  return 0;
}

Assistant:

TEST_IMPL(tcp_bind_error_addrinuse_listen) {
  struct sockaddr_in addr;
  uv_tcp_t server1, server2;
  int r;

  ASSERT_OK(uv_ip4_addr("0.0.0.0", TEST_PORT, &addr));
  r = uv_tcp_init(uv_default_loop(), &server1);
  ASSERT_OK(r);
  r = uv_tcp_bind(&server1, (const struct sockaddr*) &addr, 0);
  ASSERT_OK(r);

  r = uv_tcp_init(uv_default_loop(), &server2);
  ASSERT_OK(r);
  r = uv_tcp_bind(&server2, (const struct sockaddr*) &addr, 0);
  ASSERT_OK(r);

  r = uv_listen((uv_stream_t*)&server1, 128, NULL);
  ASSERT_OK(r);
  r = uv_listen((uv_stream_t*)&server2, 128, NULL);
  ASSERT_EQ(r, UV_EADDRINUSE);

  uv_close((uv_handle_t*)&server1, close_cb);
  uv_close((uv_handle_t*)&server2, close_cb);

  uv_run(uv_default_loop(), UV_RUN_DEFAULT);

  ASSERT_EQ(2, close_cb_called);

  MAKE_VALGRIND_HAPPY(uv_default_loop());
  return 0;
}